

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O1

double betaln(double *a0,double *b0)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_38;
  double local_20;
  
  betaln::a = *a0;
  if (*b0 <= *a0) {
    betaln::a = *b0;
  }
  betaln::b = *b0;
  if (*b0 <= *a0) {
    betaln::b = *a0;
  }
  if (8.0 <= betaln::a) {
    betaln::w = bcorr(&betaln::a,&betaln::b);
    betaln::h = betaln::a / betaln::b;
    dVar2 = betaln::a + -0.5;
    dVar5 = log(betaln::h / (betaln::h + 1.0));
    dVar3 = betaln::b;
    betaln::u = -dVar2 * dVar5;
    dVar2 = alnrel(&betaln::h);
    dVar5 = betaln::u;
    betaln::v = dVar2 * dVar3;
    dVar4 = log(betaln::b);
    dVar4 = dVar4 * -0.5 + 0.918938533204673 + betaln::w;
    if (dVar2 * dVar3 < dVar5) {
      return (dVar4 - betaln::v) - betaln::u;
    }
    return (dVar4 - betaln::u) - betaln::v;
  }
  if (1.0 <= betaln::a) {
    if (betaln::a <= 2.0) {
      if (betaln::b <= 2.0) {
        dVar3 = gamln(&betaln::a);
        dVar5 = gamln(&betaln::b);
        dVar2 = gsumln(&betaln::a,&betaln::b);
        return (dVar5 + dVar3) - dVar2;
      }
      betaln::w = 0.0;
      if (betaln::b < 8.0) {
LAB_00104217:
        dVar3 = betaln::w;
        betaln::n = (int)(betaln::b + -1.0);
        betaln::z = 1.0;
        if (0 < betaln::n) {
          betaln::z = 1.0;
          iVar1 = betaln::n;
          do {
            betaln::b = betaln::b + -1.0;
            betaln::z = betaln::z * (betaln::b / (betaln::b + betaln::a));
            iVar1 = iVar1 + -1;
          } while (iVar1 != 0);
        }
        local_20 = log(betaln::z);
        local_20 = local_20 + dVar3;
        dVar2 = gamln(&betaln::a);
        dVar3 = gamln(&betaln::b);
        dVar5 = gsumln(&betaln::a,&betaln::b);
        dVar2 = (dVar3 - dVar5) + dVar2;
LAB_001042fe:
        return dVar2 + local_20;
      }
      goto LAB_00104163;
    }
    betaln::n = (int)(betaln::a + -1.0);
    betaln::w = 1.0;
    if (1000.0 < betaln::b) {
      if (0 < betaln::n) {
        betaln::w = 1.0;
        iVar1 = betaln::n;
        do {
          betaln::a = betaln::a + -1.0;
          betaln::w = betaln::w * (betaln::a / (betaln::a / betaln::b + 1.0));
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
      }
      local_38 = log(betaln::w);
      dVar3 = (double)betaln::n;
      dVar5 = log(betaln::b);
      local_38 = local_38 - dVar5 * dVar3;
      dVar3 = gamln(&betaln::a);
      dVar5 = algdiv(&betaln::a,&betaln::b);
      dVar5 = dVar5 + dVar3;
      goto LAB_00104186;
    }
    if (0 < betaln::n) {
      betaln::w = 1.0;
      iVar1 = betaln::n;
      do {
        betaln::a = betaln::a + -1.0;
        betaln::h = betaln::a / betaln::b;
        betaln::w = betaln::w * (betaln::h / (betaln::h + 1.0));
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    local_38 = log(betaln::w);
    betaln::w = local_38;
    if (betaln::b < 8.0) goto LAB_00104217;
    dVar3 = gamln(&betaln::a);
    local_38 = local_38 + dVar3;
  }
  else {
    if (betaln::b < 8.0) {
      betaln::T1 = betaln::a + betaln::b;
      local_20 = gamln(&betaln::a);
      dVar2 = gamln(&betaln::b);
      dVar3 = gamln(&betaln::T1);
      dVar2 = dVar2 - dVar3;
      goto LAB_001042fe;
    }
LAB_00104163:
    local_38 = gamln(&betaln::a);
  }
  dVar5 = algdiv(&betaln::a,&betaln::b);
LAB_00104186:
  return dVar5 + local_38;
}

Assistant:

double betaln(double *a0,double *b0)
/*
-----------------------------------------------------------------------
     EVALUATION OF THE LOGARITHM OF THE BETA FUNCTION
-----------------------------------------------------------------------
     E = 0.5*LN(2*PI)
--------------------------
*/
{
static double e = .918938533204673e0;
static double betaln,a,b,c,h,u,v,w,z;
static int i,n;
static double T1;
/*
     ..
     .. Executable Statements ..
*/
    a = fifdmin1(*a0,*b0);
    b = fifdmax1(*a0,*b0);
    if(a >= 8.0e0) goto S100;
    if(a >= 1.0e0) goto S20;
/*
-----------------------------------------------------------------------
                   PROCEDURE WHEN A .LT. 1
-----------------------------------------------------------------------
*/
    if(b >= 8.0e0) goto S10;
    T1 = a+b;
    betaln = gamln(&a)+(gamln(&b)-gamln(&T1));
    return betaln;
S10:
    betaln = gamln(&a)+algdiv(&a,&b);
    return betaln;
S20:
/*
-----------------------------------------------------------------------
                PROCEDURE WHEN 1 .LE. A .LT. 8
-----------------------------------------------------------------------
*/
    if(a > 2.0e0) goto S40;
    if(b > 2.0e0) goto S30;
    betaln = gamln(&a)+gamln(&b)-gsumln(&a,&b);
    return betaln;
S30:
    w = 0.0e0;
    if(b < 8.0e0) goto S60;
    betaln = gamln(&a)+algdiv(&a,&b);
    return betaln;
S40:
/*
                REDUCTION OF A WHEN B .LE. 1000
*/
    if(b > 1000.0e0) goto S80;
    n = a-1.0e0;
    w = 1.0e0;
    for(i=1; i<=n; i++) {
        a -= 1.0e0;
        h = a/b;
        w *= (h/(1.0e0+h));
    }
    w = log(w);
    if(b < 8.0e0) goto S60;
    betaln = w+gamln(&a)+algdiv(&a,&b);
    return betaln;
S60:
/*
                 REDUCTION OF B WHEN B .LT. 8
*/
    n = b-1.0e0;
    z = 1.0e0;
    for(i=1; i<=n; i++) {
        b -= 1.0e0;
        z *= (b/(a+b));
    }
    betaln = w+log(z)+(gamln(&a)+(gamln(&b)-gsumln(&a,&b)));
    return betaln;
S80:
/*
                REDUCTION OF A WHEN B .GT. 1000
*/
    n = a-1.0e0;
    w = 1.0e0;
    for(i=1; i<=n; i++) {
        a -= 1.0e0;
        w *= (a/(1.0e0+a/b));
    }
    betaln = log(w)-(double)n*log(b)+(gamln(&a)+algdiv(&a,&b));
    return betaln;
S100:
/*
-----------------------------------------------------------------------
                   PROCEDURE WHEN A .GE. 8
-----------------------------------------------------------------------
*/
    w = bcorr(&a,&b);
    h = a/b;
    c = h/(1.0e0+h);
    u = -((a-0.5e0)*log(c));
    v = b*alnrel(&h);
    if(u <= v) goto S110;
    betaln = -(0.5e0*log(b))+e+w-v-u;
    return betaln;
S110:
    betaln = -(0.5e0*log(b))+e+w-u-v;
    return betaln;
}